

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O1

size_t __thiscall solution::next_possible_step_ix(solution *this,size_t ix)

{
  _Map_pointer ppsVar1;
  bool bVar2;
  reference this_00;
  
  while( true ) {
    ppsVar1 = (this->possible_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (((long)(this->possible_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
               super__Deque_impl_data._M_start._M_last -
         (long)(this->possible_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) * 0x6db6db6db6db6db7 +
        ((long)(this->possible_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(this->possible_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3) * 0x6db6db6db6db6db7 +
        (((long)ppsVar1 -
          (long)(this->possible_steps).super__Deque_base<step,_std::allocator<step>_>._M_impl.
                super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(ppsVar1 == (_Map_pointer)0x0)) * 9 <= ix) {
      return ix;
    }
    this_00 = std::_Deque_iterator<step,_step_&,_step_*>::operator[]
                        (&(this->possible_steps).super__Deque_base<step,_std::allocator<step>_>.
                          _M_impl.super__Deque_impl_data._M_start,ix);
    bVar2 = step::can_apply(this_00);
    if (bVar2) break;
    ix = ix + 1;
  }
  return ix;
}

Assistant:

std::size_t solution::next_possible_step_ix(std::size_t ix)
{
	for (; ix < possible_steps.size(); ++ix) {
		if (possible_steps[ix].can_apply())
			break;
	}
	return ix;
}